

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaf.hpp
# Opt level: O2

bool __thiscall metaf::TrendGroup::isProbabilityGroup(TrendGroup *this)

{
  byte bVar1;
  
  bVar1 = 0;
  if ((this->t == PROB) && (bVar1 = 0, this->prob != NONE)) {
    if ((((this->tFrom).super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
          super__Optional_payload_base<metaf::MetafTime>._M_engaged & 1U) == 0) &&
       (((this->tTill).super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
         super__Optional_payload_base<metaf::MetafTime>._M_engaged & 1U) == 0)) {
      bVar1 = (this->tAt).super__Optional_base<metaf::MetafTime,_true,_true>._M_payload.
              super__Optional_payload_base<metaf::MetafTime>._M_engaged ^ 1;
    }
    else {
      bVar1 = 0;
    }
  }
  return (bool)(bVar1 & 1);
}

Assistant:

bool TrendGroup::isProbabilityGroup() const {
	// Probability group has format PROB30 or PROB40
	// Probability must be reported and no time allowed
	if (type() != Type::PROB) return false;
	if (probability() == Probability::NONE) return false;
	if (timeFrom().has_value() || timeUntil().has_value()) return false;
	if (timeAt().has_value()) return false;
	return true;
}